

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::TextBasedObject::Copy(TextBasedObject *this,TextBasedObject *rhs)

{
  TextBasedObject *rhs_local;
  TextBasedObject *this_local;
  
  DescriptiveObject::Copy(&this->super_DescriptiveObject,&rhs->super_DescriptiveObject);
  UL::operator=(&this->PayloadSchemeID,&rhs->PayloadSchemeID);
  UTF16String::operator=(&this->TextMIMEMediaType,&rhs->TextMIMEMediaType);
  UTF16String::operator=(&this->RFC5646TextLanguageCode,&rhs->RFC5646TextLanguageCode);
  optional_property<ASDCP::MXF::UTF16String>::operator=
            (&this->TextDataDescription,&rhs->TextDataDescription);
  return;
}

Assistant:

void
TextBasedObject::Copy(const TextBasedObject& rhs)
{
  DescriptiveObject::Copy(rhs);
  PayloadSchemeID = rhs.PayloadSchemeID;
  TextMIMEMediaType = rhs.TextMIMEMediaType;
  RFC5646TextLanguageCode = rhs.RFC5646TextLanguageCode;
  TextDataDescription = rhs.TextDataDescription;
}